

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall
Clasp::ClaspFacade::SolveStrategy::SolveStrategy
          (SolveStrategy *this,SolveMode_t m,ClaspFacade *f,SolveAlgorithm *algo)

{
  this->_vptr_SolveStrategy = (_func_int **)&PTR__SolveStrategy_001e62a0;
  this->facade_ = f;
  this->algo_ = algo;
  (this->error_)._M_dataplus._M_p = (pointer)&(this->error_).field_2;
  (this->error_)._M_string_length = 0;
  (this->error_).field_2._M_local_buf[0] = '\0';
  this->handler_ = (EventHandler *)0x0;
  (this->mode_).val_ = m.val_;
  LOCK();
  (this->nrefs_).super___atomic_base<unsigned_int>._M_i = 1;
  UNLOCK();
  LOCK();
  (this->signal_).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->state_).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

ClaspFacade::SolveStrategy::SolveStrategy(SolveMode_t m, ClaspFacade& f, SolveAlgorithm* algo)
	: facade_(&f)
	, algo_(algo)
	, handler_(0)
	, mode_(m) {
	nrefs_ = 1;
	state_ = signal_ = 0;
}